

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int floatx80_lt_quiet_m68k(floatx80 a,floatx80 b,float_status *status)

{
  ushort uVar1;
  ushort uVar2;
  unkuint10 Var3;
  unkuint10 Var4;
  _Bool _Var5;
  flag fVar6;
  flag fVar7;
  byte bVar8;
  int32_t iVar9;
  int iVar10;
  uint64_t uVar11;
  uint64_t b1;
  uint64_t a1;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  floatx80 a_08;
  floatx80 a_09;
  uint local_40;
  bool local_3b;
  flag bSign;
  flag aSign;
  float_status *status_local;
  floatx80 b_local;
  floatx80 a_local;
  
  b1 = b.low;
  a1 = a.low;
  uVar2 = b.high;
  uVar1 = a.high;
  Var4 = a._0_10_;
  a_00._10_6_ = 0;
  a_00.low = (long)Var4;
  a_00.high = (short)(Var4 >> 0x40);
  _Var5 = floatx80_invalid_encoding(a_00);
  if (!_Var5) {
    Var3 = b._0_10_;
    a_01._10_6_ = 0;
    a_01.low = (long)Var3;
    a_01.high = (short)(Var3 >> 0x40);
    _Var5 = floatx80_invalid_encoding(a_01);
    if (!_Var5) {
      a_02._10_6_ = 0;
      a_02.low = (long)Var4;
      a_02.high = (short)(Var4 >> 0x40);
      iVar9 = extractFloatx80Exp(a_02);
      if (((iVar9 != 0x7fff) ||
          (a_03._10_6_ = 0, a_03.low = (long)Var4, a_03.high = (short)(Var4 >> 0x40),
          uVar11 = extractFloatx80Frac(a_03), (uVar11 & 0x7fffffffffffffff) == 0)) &&
         ((a_04._10_6_ = 0, a_04.low = (long)Var3, a_04.high = (short)(Var3 >> 0x40),
          iVar9 = extractFloatx80Exp(a_04), iVar9 != 0x7fff ||
          (a_05._10_6_ = 0, a_05.low = (long)Var3, a_05.high = (short)(Var3 >> 0x40),
          uVar11 = extractFloatx80Frac(a_05), (uVar11 & 0x7fffffffffffffff) == 0)))) {
        a_08._10_6_ = 0;
        a_08.low = (long)Var4;
        a_08.high = (short)(Var4 >> 0x40);
        fVar6 = extractFloatx80Sign(a_08);
        a_09._10_6_ = 0;
        a_09.low = (long)Var3;
        a_09.high = (short)(Var3 >> 0x40);
        fVar7 = extractFloatx80Sign(a_09);
        if (fVar6 != fVar7) {
          local_3b = false;
          if (fVar6 != '\0') {
            local_3b = (((uVar1 | uVar2) & 0x7fff) != 0 || a1 != 0) || b1 != 0;
          }
          return (uint)local_3b;
        }
        if (fVar6 == '\0') {
          bVar8 = lt128((ulong)uVar1,a1,(ulong)uVar2,b1);
        }
        else {
          bVar8 = lt128((ulong)uVar2,b1,(ulong)uVar1,a1);
        }
        local_40 = (uint)bVar8;
        return local_40;
      }
      a_06._10_6_ = 0;
      a_06.low = (long)Var4;
      a_06.high = (short)(Var4 >> 0x40);
      iVar10 = floatx80_is_signaling_nan_m68k(a_06,status);
      if ((iVar10 != 0) ||
         (a_07._10_6_ = 0, a_07.low = (long)Var3, a_07.high = (short)(Var3 >> 0x40),
         iVar10 = floatx80_is_signaling_nan_m68k(a_07,status), iVar10 != 0)) {
        float_raise_m68k('\x01',status);
      }
      return 0;
    }
  }
  float_raise_m68k('\x01',status);
  return 0;
}

Assistant:

int floatx80_lt_quiet(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, bSign;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return 0;
    }
    if (    (    ( extractFloatx80Exp( a ) == 0x7FFF )
              && (uint64_t) ( extractFloatx80Frac( a )<<1 ) )
         || (    ( extractFloatx80Exp( b ) == 0x7FFF )
              && (uint64_t) ( extractFloatx80Frac( b )<<1 ) )
       ) {
        if (floatx80_is_signaling_nan(a, status)
         || floatx80_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    aSign = extractFloatx80Sign( a );
    bSign = extractFloatx80Sign( b );
    if ( aSign != bSign ) {
        return
               aSign
            && (    ( ( (uint16_t) ( ( a.high | b.high )<<1 ) ) | a.low | b.low )
                 != 0 );
    }
    return
          aSign ? lt128( b.high, b.low, a.high, a.low )
        : lt128( a.high, a.low, b.high, b.low );

}